

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::GetDecimalFirstFunction<false,true>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  duckdb dVar1;
  LogicalType *type_00;
  LogicalType *type_01;
  LogicalType *type_02;
  LogicalType *type_03;
  LogicalType LStack_28;
  
  dVar1 = this[1];
  if (dVar1 == (duckdb)0x9) {
    LogicalType::LogicalType(&LStack_28,BIGINT);
    GetFirstFunction<false,true>(__return_storage_ptr__,(duckdb *)&LStack_28,type_02);
  }
  else if (dVar1 == (duckdb)0x7) {
    LogicalType::LogicalType(&LStack_28,INTEGER);
    GetFirstFunction<false,true>(__return_storage_ptr__,(duckdb *)&LStack_28,type_01);
  }
  else if (dVar1 == (duckdb)0x5) {
    LogicalType::LogicalType(&LStack_28,SMALLINT);
    GetFirstFunction<false,true>(__return_storage_ptr__,(duckdb *)&LStack_28,type_00);
  }
  else {
    LogicalType::LogicalType(&LStack_28,HUGEINT);
    GetFirstFunction<false,true>(__return_storage_ptr__,(duckdb *)&LStack_28,type_03);
  }
  LogicalType::~LogicalType(&LStack_28);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetDecimalFirstFunction(const LogicalType &type) {
	D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
	switch (type.InternalType()) {
	case PhysicalType::INT16:
		return GetFirstFunction<LAST, SKIP_NULLS>(LogicalType::SMALLINT);
	case PhysicalType::INT32:
		return GetFirstFunction<LAST, SKIP_NULLS>(LogicalType::INTEGER);
	case PhysicalType::INT64:
		return GetFirstFunction<LAST, SKIP_NULLS>(LogicalType::BIGINT);
	default:
		return GetFirstFunction<LAST, SKIP_NULLS>(LogicalType::HUGEINT);
	}
}